

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpCrashHandler.c
# Opt level: O0

void signalHandler(int sigNum)

{
  SignalInfo *pSVar1;
  char *local_38;
  qpCrashType local_2c;
  char *name;
  qpCrashType type;
  SignalInfo *info;
  int sigNum_local;
  
  pSVar1 = getSignalInfo(sigNum);
  if (pSVar1 == (SignalInfo *)0x0) {
    local_2c = QP_CRASHTYPE_OTHER;
    local_38 = "Unknown signal";
  }
  else {
    local_2c = pSVar1->type;
    local_38 = pSVar1->name;
  }
  qpCrashInfo_set(&g_crashHandler->crashInfo,local_2c,local_38,(char *)0x0,0);
  if (g_crashHandler->crashHandlerFunc != (qpCrashHandlerFunc)0x0) {
    (*g_crashHandler->crashHandlerFunc)(g_crashHandler,g_crashHandler->handlerUserPointer);
  }
  return;
}

Assistant:

static void signalHandler (int sigNum)
{
	const SignalInfo*	info	= getSignalInfo(sigNum);
	qpCrashType			type	= info ? info->type : QP_CRASHTYPE_OTHER;
	const char*			name	= info ? info->name : "Unknown signal";

	qpCrashInfo_set(&g_crashHandler->crashInfo, type, name, DE_NULL, 0);

	if (g_crashHandler->crashHandlerFunc != DE_NULL)
		g_crashHandler->crashHandlerFunc(g_crashHandler, g_crashHandler->handlerUserPointer);
}